

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::updateEditorData
          (QAbstractItemViewPrivate *this,QModelIndex *tl,QModelIndex *br)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  Span *pSVar4;
  Entry *pEVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long *plVar10;
  uint uVar11;
  long lVar12;
  long in_FS_OFFSET;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  QModelIndex local_a0;
  undefined1 *local_88;
  undefined1 *puStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  piter local_70;
  QHash<QPersistentModelIndex,_QEditorInfo> local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  bVar6 = QModelIndex::isValid(tl);
  if (bVar6) {
    bVar6 = QModelIndex::isValid(br);
  }
  else {
    bVar6 = false;
  }
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_58,tl);
  local_60.d = (this->indexEditorHash).d;
  if ((local_60.d != (Data *)0x0) &&
     (((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::constBegin(&local_60);
  do {
    if (local_70.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0 &&
        local_70.bucket == 0) {
      QHash<QPersistentModelIndex,_QEditorInfo>::~QHash(&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pSVar4 = (local_70.d)->spans;
    uVar9 = local_70.bucket >> 7;
    uVar11 = (uint)local_70.bucket & 0x7f;
    lVar12 = *(long *)(pSVar4[uVar9].entries[pSVar4[uVar9].offsets[uVar11]].storage.data + 8);
    if ((lVar12 == 0) || (*(int *)(lVar12 + 4) == 0)) {
      lVar12 = 0;
    }
    else {
      lVar12 = *(long *)(pSVar4[uVar9].entries[pSVar4[uVar9].offsets[uVar11]].storage.data + 0x10);
    }
    local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_88,
               (QPersistentModelIndex *)(pSVar4[uVar9].entries + pSVar4[uVar9].offsets[uVar11]));
    if ((lVar12 != 0) &&
       (pEVar5 = (local_70.d)->spans[local_70.bucket >> 7].entries,
       pEVar5[(local_70.d)->spans[local_70.bucket >> 7].offsets[(uint)local_70.bucket & 0x7f]].
       storage.data[0x18] == '\0')) {
      iVar8 = (int)local_88;
      iVar14 = (int)((ulong)local_88 >> 0x20);
      auVar15._0_4_ = -(uint)(-1 < iVar8);
      auVar15._4_4_ = -(uint)(-1 < iVar8);
      auVar15._8_4_ = -(uint)(-1 < (long)local_88);
      auVar15._12_4_ = -(uint)(-1 < (long)local_88);
      uVar11 = movmskpd((int)pEVar5,auVar15);
      if (((uVar11 & 1) != 0) &&
         (((byte)((byte)uVar11 >> 1) != 0 && (local_78.ptr != (QAbstractItemModel *)0x0)))) {
        if (bVar6 == false) {
LAB_004e6684:
          plVar10 = (long *)(**(code **)(*plVar3 + 0x208))(plVar3,(QModelIndex *)&local_88);
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 0x80))(plVar10,lVar12,(QModelIndex *)&local_88);
          }
        }
        else {
          uVar1 = tl->r;
          uVar2 = tl->c;
          auVar13._0_4_ = -(uint)(br->r < iVar8);
          auVar13._4_4_ = -(uint)(br->c < iVar14);
          auVar13._8_4_ = -(uint)(iVar8 < (int)uVar1);
          auVar13._12_4_ = -(uint)(iVar14 < (int)uVar2);
          iVar8 = movmskps((int)br,auVar13);
          if (iVar8 == 0) {
            QModelIndex::parent(&local_a0,(QModelIndex *)&local_88);
            bVar7 = ::operator!=(&local_a0,(QModelIndex *)&local_58);
            if (!bVar7) goto LAB_004e6684;
          }
        }
      }
    }
    QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::operator++
              (&local_70);
  } while( true );
}

Assistant:

void QAbstractItemViewPrivate::updateEditorData(const QModelIndex &tl, const QModelIndex &br)
{
    Q_Q(QAbstractItemView);
    // we are counting on having relatively few editors
    const bool checkIndexes = tl.isValid() && br.isValid();
    const QModelIndex parent = tl.parent();
    // QTBUG-25370: We need to copy the indexEditorHash, because while we're
    // iterating over it, we are calling methods which can allow user code to
    // call a method on *this which can modify the member indexEditorHash.
    const QIndexEditorHash indexEditorHashCopy = indexEditorHash;
    QIndexEditorHash::const_iterator it = indexEditorHashCopy.constBegin();
    for (; it != indexEditorHashCopy.constEnd(); ++it) {
        QWidget *editor = it.value().widget.data();
        const QModelIndex index = it.key();
        if (it.value().isStatic || !editor || !index.isValid() ||
            (checkIndexes
                && (index.row() < tl.row() || index.row() > br.row()
                    || index.column() < tl.column() || index.column() > br.column()
                    || index.parent() != parent)))
            continue;

        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (delegate) {
            delegate->setEditorData(editor, index);
        }
    }
}